

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall net_tests::cnetaddr_basic::test_method(cnetaddr_basic *this)

{
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  DNSLookupFn dns_lookup_function_01;
  DNSLookupFn dns_lookup_function_02;
  DNSLookupFn dns_lookup_function_03;
  DNSLookupFn dns_lookup_function_04;
  DNSLookupFn dns_lookup_function_05;
  undefined8 uVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  readonly_property65 rVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  string_view str;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  char *torv3_addr;
  string scoped_addr;
  string link_local;
  CNetAddr addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined4 in_stack_fffffffffffff218;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff21c;
  undefined4 uVar9;
  check_type cVar13;
  char *pcVar10;
  _Manager_type in_stack_fffffffffffff228;
  lazy_ostream *plVar11;
  _Invoker_type in_stack_fffffffffffff230;
  char *pcVar12;
  char *local_dc0;
  char *local_db8;
  undefined1 *local_db0;
  undefined1 *local_da8;
  char *local_da0;
  char *local_d98;
  undefined1 *local_d90;
  undefined1 *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  char *local_d68;
  undefined1 *local_d60;
  undefined1 *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  char *local_d38;
  undefined1 *local_d30;
  undefined1 *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  char *local_d08;
  undefined1 *local_d00;
  undefined1 *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  char *local_cd8;
  undefined1 *local_cd0;
  undefined1 *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  undefined1 *local_c70;
  undefined1 *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  undefined1 *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  char *local_c18;
  undefined1 *local_c10;
  undefined1 *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  char *local_bd0;
  char *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  undefined1 *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  undefined1 *local_aa0;
  undefined1 *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  _Any_data local_768;
  code *local_758;
  assertion_result local_748;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  _Any_data local_678;
  code *local_668;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  _Any_data local_578;
  code *local_568;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  _Any_data local_478;
  code *local_468;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  _Any_data local_378;
  code *local_368;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  _Any_data local_278;
  code *local_268;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  _Any_data local_178;
  code *local_168;
  string *local_158;
  string *local_150;
  char *local_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [8];
  undefined1 local_128 [8];
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  string local_100;
  string local_e0;
  undefined1 local_c0 [16];
  _func_int *local_b0;
  char *local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  bool local_80;
  direct_or_indirect local_78;
  uint local_68;
  string **local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr((CNetAddr *)&local_78.indirect_contents);
  local_58._0_8_ = &aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"0.0.0.0","");
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_178,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffff21c;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffff218;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = (undefined8)_cVar13;
  dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffff228;
  dns_lookup_function._M_invoker = in_stack_fffffffffffff230;
  LookupHost((optional<CNetAddr> *)local_a0,(string *)local_58,false,dns_lookup_function);
  if (local_80 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    if (0x10 < local_68) {
      free(local_78.indirect_contents.indirect);
    }
    local_78.indirect_contents.indirect = (char *)local_a0._0_8_;
    local_78.indirect_contents.capacity = local_a0._8_4_;
    local_78._12_4_ = local_a0._12_4_;
    local_68 = local_90._M_allocated_capacity._0_4_;
    local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffff00000000;
    local_60 = (string **)local_90._8_8_;
    if (local_80 == true) {
      local_80 = false;
    }
    if (local_168 != (code *)0x0) {
      (*local_168)(&local_178,&local_178,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
    }
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_180 = "";
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x8d;
    file.m_begin = (iterator)&local_188;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
    bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
    local_58._8_8_ = (element_type *)0x0;
    aStack_48._M_allocated_capacity = 0;
    local_c0._0_8_ = "!addr.IsValid()";
    local_c0._8_8_ = "";
    local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
    local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1a0 = "";
    pvVar6 = (iterator)0x2;
    pvVar7 = (iterator)0x0;
    local_90._8_8_ = local_c0;
    local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,_cVar13,
               (size_t)&local_1a8,0x8d);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1b0 = "";
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x8e;
    file_00.m_begin = (iterator)&local_1b8;
    msg_00.m_end = pvVar7;
    msg_00.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
               msg_00);
    local_58[0] = (class_property<bool>)((int)local_60 == 1);
    local_58._8_8_ = (element_type *)0x0;
    aStack_48._M_allocated_capacity = 0;
    local_c0._0_8_ = "addr.IsIPv4()";
    local_c0._8_8_ = "";
    local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
    local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_1d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1d0 = "";
    pvVar6 = (iterator)0x2;
    pvVar7 = (iterator)0x0;
    local_90._8_8_ = local_c0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,_cVar13,
               (size_t)&local_1d8,0x8e);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1e0 = "";
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x90;
    file_01.m_begin = (iterator)&local_1e8;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1f8,
               msg_01);
    local_58[0] = (class_property<bool>)CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents)
    ;
    local_58._8_8_ = (element_type *)0x0;
    aStack_48._M_allocated_capacity = 0;
    local_c0._0_8_ = "addr.IsBindAny()";
    local_c0._8_8_ = "";
    local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
    local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_208 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_200 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x0;
    local_90._8_8_ = local_c0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,_cVar13,
               (size_t)&local_208,0x90);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
    local_218 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_210 = "";
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x91;
    file_02.m_begin = (iterator)&local_218;
    msg_02.m_end = pvVar7;
    msg_02.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_228,
               msg_02);
    local_58[0] = (class_property<bool>)
                  CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
    local_58._8_8_ = (element_type *)0x0;
    aStack_48._M_allocated_capacity = 0;
    local_c0._0_8_ = "addr.IsAddrV1Compatible()";
    local_c0._8_8_ = "";
    plVar11 = (lazy_ostream *)local_a0;
    local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
    local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_230 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x0;
    local_90._8_8_ = local_c0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,plVar11,1,0,WARN,_cVar13,(size_t)&local_238,0x91);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_240 = "";
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x92;
    file_03.m_begin = (iterator)&local_248;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_258,
               msg_03);
    local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
    local_c0._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
    local_a8 = "";
    CNetAddr::ToStringAddr_abi_cxx11_(&local_e0,(CNetAddr *)&local_78.indirect_contents);
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_e0,"0.0.0.0");
    local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
    local_748.m_message.px = (element_type *)0x0;
    local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_100._M_string_length = 0xedd78d;
    local_90._8_8_ = local_120;
    local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
    local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_48._8_8_ = local_140;
    local_140._0_8_ = "0.0.0.0";
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d4530;
    aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pcVar12 = "\"0.0.0.0\"";
    pcVar10 = "addr.ToStringAddr()";
    uVar8 = 2;
    uVar9 = 0;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_120._0_8_ = &local_e0;
    boost::test_tools::tt_detail::report_assertion
              (&local_748,(lazy_ostream *)local_c0,1,2,REQUIRE,0xee2515,(size_t)&local_100,0x92,
               plVar11,"\"0.0.0.0\"",(assertion_result *)local_58);
    boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_58._0_8_ = &aStack_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"255.255.255.255","");
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_278,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function_00.super__Function_base._M_functor._4_4_ = uVar9;
    dns_lookup_function_00.super__Function_base._M_functor._0_4_ = uVar8;
    dns_lookup_function_00.super__Function_base._M_functor._8_8_ = pcVar10;
    dns_lookup_function_00.super__Function_base._M_manager = (_Manager_type)plVar11;
    dns_lookup_function_00._M_invoker = (_Invoker_type)pcVar12;
    LookupHost((optional<CNetAddr> *)local_a0,(string *)local_58,false,dns_lookup_function_00);
    if (local_80 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      if (0x10 < local_68) {
        free(local_78.indirect_contents.indirect);
      }
      local_78.indirect_contents.indirect = (char *)local_a0._0_8_;
      local_78.indirect_contents.capacity = local_a0._8_4_;
      local_78._12_4_ = local_a0._12_4_;
      local_68 = local_90._M_allocated_capacity._0_4_;
      local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffff00000000;
      local_60 = (string **)local_90._8_8_;
      if (local_80 == true) {
        local_80 = false;
      }
      if (local_268 != (code *)0x0) {
        (*local_268)(&local_278,&local_278,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &aStack_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
      }
      local_288 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_280 = "";
      local_298 = &boost::unit_test::basic_cstring<char_const>::null;
      local_290 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x96;
      file_04.m_begin = (iterator)&local_288;
      msg_04.m_end = pvVar7;
      msg_04.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_298,
                 msg_04);
      bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
      local_58._8_8_ = (element_type *)0x0;
      aStack_48._M_allocated_capacity = 0;
      local_c0._0_8_ = "!addr.IsValid()";
      local_c0._8_8_ = "";
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2a0 = "";
      pvVar6 = (iterator)0x2;
      pvVar7 = (iterator)0x0;
      local_90._8_8_ = (lazy_ostream *)local_c0;
      local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,(check_type)pcVar10,
                 (size_t)&local_2a8,0x96);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
      local_2b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2b0 = "";
      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x97;
      file_05.m_begin = (iterator)&local_2b8;
      msg_05.m_end = pvVar7;
      msg_05.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2c8,
                 msg_05);
      local_58[0] = (class_property<bool>)((int)local_60 == 1);
      local_58._8_8_ = (element_type *)0x0;
      aStack_48._M_allocated_capacity = 0;
      local_c0._0_8_ = "addr.IsIPv4()";
      local_c0._8_8_ = "";
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2d0 = "";
      pvVar6 = (iterator)0x2;
      pvVar7 = (iterator)0x0;
      local_90._8_8_ = (lazy_ostream *)local_c0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,(check_type)pcVar10,
                 (size_t)&local_2d8,0x97);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
      local_2e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2e0 = "";
      local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x99;
      file_06.m_begin = (iterator)&local_2e8;
      msg_06.m_end = pvVar7;
      msg_06.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2f8,
                 msg_06);
      bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
      local_58[0] = (class_property<bool>)!bVar2;
      local_58._8_8_ = (element_type *)0x0;
      aStack_48._M_allocated_capacity = 0;
      local_c0._0_8_ = "!addr.IsBindAny()";
      local_c0._8_8_ = "";
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_308 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_300 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      local_90._8_8_ = (lazy_ostream *)local_c0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,(check_type)pcVar10,
                 (size_t)&local_308,0x99);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
      local_318 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_310 = "";
      local_328 = &boost::unit_test::basic_cstring<char_const>::null;
      local_320 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0x9a;
      file_07.m_begin = (iterator)&local_318;
      msg_07.m_end = pvVar7;
      msg_07.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_328,
                 msg_07);
      local_58[0] = (class_property<bool>)
                    CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
      local_58._8_8_ = (element_type *)0x0;
      aStack_48._M_allocated_capacity = 0;
      local_c0._0_8_ = "addr.IsAddrV1Compatible()";
      local_c0._8_8_ = "";
      plVar11 = (lazy_ostream *)local_a0;
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_338 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_330 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      local_90._8_8_ = (lazy_ostream *)local_c0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_58,plVar11,1,0,WARN,(check_type)pcVar10,
                 (size_t)&local_338,0x9a);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
      local_348 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_340 = "";
      local_358 = &boost::unit_test::basic_cstring<char_const>::null;
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x9b;
      file_08.m_begin = (iterator)&local_348;
      msg_08.m_end = pvVar7;
      msg_08.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_358,
                 msg_08);
      local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
      local_a8 = "";
      CNetAddr::ToStringAddr_abi_cxx11_(&local_e0,(CNetAddr *)&local_78.indirect_contents);
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_e0,"255.255.255.255");
      local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
      local_748.m_message.px = (element_type *)0x0;
      local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_100._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
      ;
      local_100._M_string_length = 0xedd78d;
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
      local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_90._8_8_ = local_120;
      local_140._0_8_ = "255.255.255.255";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013d5500;
      aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_48._8_8_ = local_140;
      pcVar12 = "\"255.255.255.255\"";
      pcVar10 = "addr.ToStringAddr()";
      uVar8 = 2;
      uVar9 = 0;
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x2;
      local_120._0_8_ = &local_e0;
      boost::test_tools::tt_detail::report_assertion
                (&local_748,(lazy_ostream *)local_c0,1,2,REQUIRE,0xee2515,(size_t)&local_100,0x9b,
                 plVar11,"\"255.255.255.255\"",(assertion_result *)local_58);
      boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      local_58._0_8_ = &aStack_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"12.34.56.78","");
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&local_378,&g_dns_lookup_abi_cxx11_);
      dns_lookup_function_01.super__Function_base._M_functor._4_4_ = uVar9;
      dns_lookup_function_01.super__Function_base._M_functor._0_4_ = uVar8;
      dns_lookup_function_01.super__Function_base._M_functor._8_8_ = pcVar10;
      dns_lookup_function_01.super__Function_base._M_manager = (_Manager_type)plVar11;
      dns_lookup_function_01._M_invoker = (_Invoker_type)pcVar12;
      LookupHost((optional<CNetAddr> *)local_a0,(string *)local_58,false,dns_lookup_function_01);
      if (local_80 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        if (0x10 < local_68) {
          free(local_78.indirect_contents.indirect);
        }
        local_78.indirect_contents.indirect = (char *)local_a0._0_8_;
        local_78.indirect_contents.capacity = local_a0._8_4_;
        local_78._12_4_ = local_a0._12_4_;
        local_68 = local_90._M_allocated_capacity._0_4_;
        local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffff00000000;
        local_60 = (string **)local_90._8_8_;
        if (local_80 == true) {
          local_80 = false;
        }
        if (local_368 != (code *)0x0) {
          (*local_368)(&local_378,&local_378,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &aStack_48) {
          operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
        }
        local_388 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_380 = "";
        local_398 = &boost::unit_test::basic_cstring<char_const>::null;
        local_390 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0x9f;
        file_09.m_begin = (iterator)&local_388;
        msg_09.m_end = pvVar7;
        msg_09.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_398
                   ,msg_09);
        rVar3.super_class_property<bool>.value =
             (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
        local_58._8_8_ = (element_type *)0x0;
        aStack_48._M_allocated_capacity = 0;
        local_c0._0_8_ = "addr.IsValid()";
        local_c0._8_8_ = "";
        local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
        local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
        local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_3a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3a0 = "";
        pvVar6 = (iterator)0x2;
        pvVar7 = (iterator)0x0;
        local_90._8_8_ = (lazy_ostream *)local_c0;
        local_58[0] = rVar3.super_class_property<bool>.value;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                   (check_type)pcVar10,(size_t)&local_3a8,0x9f);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity)
        ;
        local_3b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3b0 = "";
        local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0xa0;
        file_10.m_begin = (iterator)&local_3b8;
        msg_10.m_end = pvVar7;
        msg_10.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3c8
                   ,msg_10);
        local_58[0] = (class_property<bool>)((int)local_60 == 1);
        local_58._8_8_ = (element_type *)0x0;
        aStack_48._M_allocated_capacity = 0;
        local_c0._0_8_ = "addr.IsIPv4()";
        local_c0._8_8_ = "";
        local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
        local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
        local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_3d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3d0 = "";
        pvVar6 = (iterator)0x2;
        pvVar7 = (iterator)0x0;
        local_90._8_8_ = (lazy_ostream *)local_c0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                   (check_type)pcVar10,(size_t)&local_3d8,0xa0);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity)
        ;
        local_3e8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3e0 = "";
        local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xa2;
        file_11.m_begin = (iterator)&local_3e8;
        msg_11.m_end = pvVar7;
        msg_11.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3f8
                   ,msg_11);
        bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
        local_58[0] = (class_property<bool>)!bVar2;
        local_58._8_8_ = (element_type *)0x0;
        aStack_48._M_allocated_capacity = 0;
        local_c0._0_8_ = "!addr.IsBindAny()";
        local_c0._8_8_ = "";
        local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
        local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
        local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_408 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_400 = "";
        pvVar6 = (iterator)0x1;
        pvVar7 = (iterator)0x0;
        local_90._8_8_ = (lazy_ostream *)local_c0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                   (check_type)pcVar10,(size_t)&local_408,0xa2);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity)
        ;
        local_418 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_410 = "";
        local_428 = &boost::unit_test::basic_cstring<char_const>::null;
        local_420 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0xa3;
        file_12.m_begin = (iterator)&local_418;
        msg_12.m_end = pvVar7;
        msg_12.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_428
                   ,msg_12);
        local_58[0] = (class_property<bool>)
                      CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
        local_58._8_8_ = (element_type *)0x0;
        aStack_48._M_allocated_capacity = 0;
        local_c0._0_8_ = "addr.IsAddrV1Compatible()";
        local_c0._8_8_ = "";
        plVar11 = (lazy_ostream *)local_a0;
        local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
        local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
        local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_438 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_430 = "";
        pvVar6 = (iterator)0x1;
        pvVar7 = (iterator)0x0;
        local_90._8_8_ = (lazy_ostream *)local_c0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,plVar11,1,0,WARN,(check_type)pcVar10,
                   (size_t)&local_438,0xa3);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity)
        ;
        local_448 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_440 = "";
        local_458 = &boost::unit_test::basic_cstring<char_const>::null;
        local_450 = &boost::unit_test::basic_cstring<char_const>::null;
        file_13.m_end = (iterator)0xa4;
        file_13.m_begin = (iterator)&local_448;
        msg_13.m_end = pvVar7;
        msg_13.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_458
                   ,msg_13);
        local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
        local_c0._0_8_ = &PTR__lazy_ostream_013d3cb0;
        local_b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
        local_a8 = "";
        CNetAddr::ToStringAddr_abi_cxx11_(&local_e0,(CNetAddr *)&local_78.indirect_contents);
        iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_e0,"12.34.56.78");
        local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
        local_748.m_message.px = (element_type *)0x0;
        local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_100._M_dataplus._M_p =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_100._M_string_length = 0xedd78d;
        local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
        local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
        local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_90._8_8_ = local_120;
        local_140._0_8_ = "12.34.56.78";
        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
        local_58._0_8_ = &PTR__lazy_ostream_013d5540;
        aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        aStack_48._8_8_ = local_140;
        pcVar12 = "\"12.34.56.78\"";
        pcVar10 = "addr.ToStringAddr()";
        uVar8 = 2;
        uVar9 = 0;
        pvVar6 = (iterator)0x1;
        pvVar7 = (iterator)0x2;
        local_120._0_8_ = &local_e0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_748,(lazy_ostream *)local_c0,1,2,REQUIRE,0xee2515,(size_t)&local_100,0xa4,
                   plVar11,"\"12.34.56.78\"",(assertion_result *)local_58);
        boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        local_58._0_8_ = &aStack_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"::","");
        std::
        function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
        ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                    *)&local_478,&g_dns_lookup_abi_cxx11_);
        dns_lookup_function_02.super__Function_base._M_functor._4_4_ = uVar9;
        dns_lookup_function_02.super__Function_base._M_functor._0_4_ = uVar8;
        dns_lookup_function_02.super__Function_base._M_functor._8_8_ = pcVar10;
        dns_lookup_function_02.super__Function_base._M_manager = (_Manager_type)plVar11;
        dns_lookup_function_02._M_invoker = (_Invoker_type)pcVar12;
        LookupHost((optional<CNetAddr> *)local_a0,(string *)local_58,false,dns_lookup_function_02);
        if (local_80 == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          if (0x10 < local_68) {
            free(local_78.indirect_contents.indirect);
          }
          local_78.indirect_contents.indirect = (char *)local_a0._0_8_;
          local_78.indirect_contents.capacity = local_a0._8_4_;
          local_78._12_4_ = local_a0._12_4_;
          local_68 = local_90._M_allocated_capacity._0_4_;
          local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffff00000000;
          local_60 = (string **)local_90._8_8_;
          if (local_80 == true) {
            local_80 = false;
          }
          if (local_468 != (code *)0x0) {
            (*local_468)(&local_478,&local_478,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._0_8_ != &aStack_48) {
            operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
          }
          local_488 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_480 = "";
          local_498 = &boost::unit_test::basic_cstring<char_const>::null;
          local_490 = &boost::unit_test::basic_cstring<char_const>::null;
          file_14.m_end = (iterator)0xa8;
          file_14.m_begin = (iterator)&local_488;
          msg_14.m_end = pvVar7;
          msg_14.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_498,msg_14);
          bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          local_c0._0_8_ = "!addr.IsValid()";
          local_c0._8_8_ = "";
          local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
          local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
          local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          local_4a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4a0 = "";
          pvVar6 = (iterator)0x2;
          pvVar7 = (iterator)0x0;
          local_90._8_8_ = (lazy_ostream *)local_c0;
          local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                     (check_type)pcVar10,(size_t)&local_4a8,0xa8);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          local_4b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4b0 = "";
          local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_15.m_end = (iterator)0xa9;
          file_15.m_begin = (iterator)&local_4b8;
          msg_15.m_end = pvVar7;
          msg_15.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                     (size_t)&local_4c8,msg_15);
          local_58[0] = (class_property<bool>)((int)local_60 == 2);
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          local_c0._0_8_ = "addr.IsIPv6()";
          local_c0._8_8_ = "";
          local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
          local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
          local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          local_4d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4d0 = "";
          pvVar6 = (iterator)0x2;
          pvVar7 = (iterator)0x0;
          local_90._8_8_ = (lazy_ostream *)local_c0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                     (check_type)pcVar10,(size_t)&local_4d8,0xa9);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          local_4e8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4e0 = "";
          local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_16.m_end = (iterator)0xab;
          file_16.m_begin = (iterator)&local_4e8;
          msg_16.m_end = pvVar7;
          msg_16.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                     (size_t)&local_4f8,msg_16);
          local_58[0] = (class_property<bool>)
                        CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          local_c0._0_8_ = "addr.IsBindAny()";
          local_c0._8_8_ = "";
          local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
          local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
          local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          local_508 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_500 = "";
          pvVar6 = (iterator)0x1;
          pvVar7 = (iterator)0x0;
          local_90._8_8_ = (lazy_ostream *)local_c0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                     (check_type)pcVar10,(size_t)&local_508,0xab);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          local_518 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_510 = "";
          local_528 = &boost::unit_test::basic_cstring<char_const>::null;
          local_520 = &boost::unit_test::basic_cstring<char_const>::null;
          file_17.m_end = (iterator)0xac;
          file_17.m_begin = (iterator)&local_518;
          msg_17.m_end = pvVar7;
          msg_17.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                     (size_t)&local_528,msg_17);
          local_58[0] = (class_property<bool>)
                        CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          local_c0._0_8_ = "addr.IsAddrV1Compatible()";
          local_c0._8_8_ = "";
          plVar11 = (lazy_ostream *)local_a0;
          local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
          local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
          local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          local_538 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_530 = "";
          pvVar6 = (iterator)0x1;
          pvVar7 = (iterator)0x0;
          local_90._8_8_ = (lazy_ostream *)local_c0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,plVar11,1,0,WARN,(check_type)pcVar10,
                     (size_t)&local_538,0xac);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          local_548 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_540 = "";
          local_558 = &boost::unit_test::basic_cstring<char_const>::null;
          local_550 = &boost::unit_test::basic_cstring<char_const>::null;
          file_18.m_end = (iterator)0xad;
          file_18.m_begin = (iterator)&local_548;
          msg_18.m_end = pvVar7;
          msg_18.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                     (size_t)&local_558,msg_18);
          local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
          local_c0._0_8_ = &PTR__lazy_ostream_013d3cb0;
          local_b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
          local_a8 = "";
          CNetAddr::ToStringAddr_abi_cxx11_(&local_e0,(CNetAddr *)&local_78.indirect_contents);
          iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_e0,"::");
          local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
          local_748.m_message.px = (element_type *)0x0;
          local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100._M_dataplus._M_p =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_100._M_string_length = 0xedd78d;
          local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
          local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
          local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          local_90._8_8_ = local_120;
          local_140._0_8_ = "::";
          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
          local_58._0_8_ = &PTR__lazy_ostream_013d5440;
          aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          aStack_48._8_8_ = local_140;
          pcVar12 = "\"::\"";
          pcVar10 = "addr.ToStringAddr()";
          uVar8 = 2;
          uVar9 = 0;
          pvVar6 = (iterator)0x1;
          pvVar7 = (iterator)0x2;
          local_120._0_8_ = &local_e0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_748,(lazy_ostream *)local_c0,1,2,REQUIRE,0xee2515,(size_t)&local_100,
                     0xad,plVar11,"\"::\"",(assertion_result *)local_58);
          boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          local_58._0_8_ = &aStack_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,"1122:3344:5566:7788:9900:aabb:ccdd:eeff","");
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                      *)&local_578,&g_dns_lookup_abi_cxx11_);
          dns_lookup_function_03.super__Function_base._M_functor._4_4_ = uVar9;
          dns_lookup_function_03.super__Function_base._M_functor._0_4_ = uVar8;
          dns_lookup_function_03.super__Function_base._M_functor._8_8_ = pcVar10;
          dns_lookup_function_03.super__Function_base._M_manager = (_Manager_type)plVar11;
          dns_lookup_function_03._M_invoker = (_Invoker_type)pcVar12;
          LookupHost((optional<CNetAddr> *)local_a0,(string *)local_58,false,dns_lookup_function_03)
          ;
          if (local_80 == false) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            if (0x10 < local_68) {
              free(local_78.indirect_contents.indirect);
            }
            local_78.indirect_contents.indirect = (char *)local_a0._0_8_;
            local_78.indirect_contents.capacity = local_a0._8_4_;
            local_78._12_4_ = local_a0._12_4_;
            local_68 = local_90._M_allocated_capacity._0_4_;
            local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffff00000000;
            local_60 = (string **)local_90._8_8_;
            if (local_80 == true) {
              local_80 = false;
            }
            if (local_568 != (code *)0x0) {
              (*local_568)(&local_578,&local_578,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._0_8_ != &aStack_48) {
              operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
            }
            local_588 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_580 = "";
            local_598 = &boost::unit_test::basic_cstring<char_const>::null;
            local_590 = &boost::unit_test::basic_cstring<char_const>::null;
            file_19.m_end = (iterator)0xb1;
            file_19.m_begin = (iterator)&local_588;
            msg_19.m_end = pvVar7;
            msg_19.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                       (size_t)&local_598,msg_19);
            rVar3.super_class_property<bool>.value =
                 (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
            local_58._8_8_ = (element_type *)0x0;
            aStack_48._M_allocated_capacity = 0;
            local_c0._0_8_ = "addr.IsValid()";
            local_c0._8_8_ = "";
            local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
            local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
            local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_5a8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5a0 = "";
            pvVar6 = (iterator)0x2;
            pvVar7 = (iterator)0x0;
            local_90._8_8_ = (lazy_ostream *)local_c0;
            local_58[0] = rVar3.super_class_property<bool>.value;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                       (check_type)pcVar10,(size_t)&local_5a8,0xb1);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&aStack_48._M_allocated_capacity);
            local_5b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5b0 = "";
            local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_20.m_end = (iterator)0xb2;
            file_20.m_begin = (iterator)&local_5b8;
            msg_20.m_end = pvVar7;
            msg_20.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                       (size_t)&local_5c8,msg_20);
            local_58[0] = (class_property<bool>)((int)local_60 == 2);
            local_58._8_8_ = (element_type *)0x0;
            aStack_48._M_allocated_capacity = 0;
            local_c0._0_8_ = "addr.IsIPv6()";
            local_c0._8_8_ = "";
            local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
            local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
            local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_5d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5d0 = "";
            pvVar6 = (iterator)0x2;
            pvVar7 = (iterator)0x0;
            local_90._8_8_ = (lazy_ostream *)local_c0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                       (check_type)pcVar10,(size_t)&local_5d8,0xb2);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&aStack_48._M_allocated_capacity);
            local_5e8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5e0 = "";
            local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_21.m_end = (iterator)0xb4;
            file_21.m_begin = (iterator)&local_5e8;
            msg_21.m_end = pvVar7;
            msg_21.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                       (size_t)&local_5f8,msg_21);
            bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
            local_58[0] = (class_property<bool>)!bVar2;
            local_58._8_8_ = (element_type *)0x0;
            aStack_48._M_allocated_capacity = 0;
            local_c0._0_8_ = "!addr.IsBindAny()";
            local_c0._8_8_ = "";
            local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
            local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
            local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_608 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_600 = "";
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x0;
            local_90._8_8_ = (lazy_ostream *)local_c0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                       (check_type)pcVar10,(size_t)&local_608,0xb4);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&aStack_48._M_allocated_capacity);
            local_618 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_610 = "";
            local_628 = &boost::unit_test::basic_cstring<char_const>::null;
            local_620 = &boost::unit_test::basic_cstring<char_const>::null;
            file_22.m_end = (iterator)0xb5;
            file_22.m_begin = (iterator)&local_618;
            msg_22.m_end = pvVar7;
            msg_22.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                       (size_t)&local_628,msg_22);
            local_58[0] = (class_property<bool>)
                          CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
            local_58._8_8_ = (element_type *)0x0;
            aStack_48._M_allocated_capacity = 0;
            local_c0._0_8_ = "addr.IsAddrV1Compatible()";
            local_c0._8_8_ = "";
            plVar11 = (lazy_ostream *)local_a0;
            local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
            local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
            local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_638 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_630 = "";
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x0;
            local_90._8_8_ = (lazy_ostream *)local_c0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,plVar11,1,0,WARN,(check_type)pcVar10,
                       (size_t)&local_638,0xb5);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&aStack_48._M_allocated_capacity);
            local_648 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_640 = "";
            local_658 = &boost::unit_test::basic_cstring<char_const>::null;
            local_650 = &boost::unit_test::basic_cstring<char_const>::null;
            file_23.m_end = (iterator)0xb6;
            file_23.m_begin = (iterator)&local_648;
            msg_23.m_end = pvVar7;
            msg_23.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,
                       (size_t)&local_658,msg_23);
            local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
            local_c0._0_8_ = &PTR__lazy_ostream_013d3cb0;
            local_b0 = (_func_int *)boost::unit_test::lazy_ostream::inst;
            local_a8 = "";
            CNetAddr::ToStringAddr_abi_cxx11_(&local_e0,(CNetAddr *)&local_78.indirect_contents);
            iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_e0,"1122:3344:5566:7788:9900:aabb:ccdd:eeff");
            local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)(iVar5 == 0);
            local_748.m_message.px = (element_type *)0x0;
            local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_100._M_dataplus._M_p =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_100._M_string_length = 0xedd78d;
            local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
            local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
            local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            local_90._8_8_ = local_120;
            local_140._0_8_ = "1122:3344:5566:7788:9900:aabb:ccdd:eeff";
            local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
            local_58._0_8_ = &PTR__lazy_ostream_013d6738;
            aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            aStack_48._8_8_ = local_140;
            pcVar12 = "\"1122:3344:5566:7788:9900:aabb:ccdd:eeff\"";
            pcVar10 = "addr.ToStringAddr()";
            uVar8 = 2;
            uVar9 = 0;
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x2;
            local_120._0_8_ = &local_e0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_748,(lazy_ostream *)local_c0,1,2,REQUIRE,0xee2515,(size_t)&local_100,
                       0xb6,plVar11,"\"1122:3344:5566:7788:9900:aabb:ccdd:eeff\"",
                       (assertion_result *)local_58);
            boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            local_c0._0_8_ = &local_b0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"fe80::1","");
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,local_c0._0_8_,(char *)(local_c0._8_8_ + local_c0._0_8_))
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_e0,"%32");
            std::
            function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
            ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                        *)&local_678,&g_dns_lookup_abi_cxx11_);
            dns_lookup_function_04.super__Function_base._M_functor._4_4_ = uVar9;
            dns_lookup_function_04.super__Function_base._M_functor._0_4_ = uVar8;
            dns_lookup_function_04.super__Function_base._M_functor._8_8_ = pcVar10;
            dns_lookup_function_04.super__Function_base._M_manager = (_Manager_type)plVar11;
            dns_lookup_function_04._M_invoker = (_Invoker_type)pcVar12;
            LookupHost((optional<CNetAddr> *)local_a0,&local_e0,false,dns_lookup_function_04);
            if (local_80 == false) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              if (0x10 < local_68) {
                free(local_78.indirect_contents.indirect);
              }
              local_78.indirect_contents.indirect = (char *)local_a0._0_8_;
              local_78.indirect_contents.capacity = local_a0._8_4_;
              local_78._12_4_ = local_a0._12_4_;
              local_68 = local_90._M_allocated_capacity._0_4_;
              local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffff00000000;
              local_60 = (string **)local_90._8_8_;
              if (local_80 == true) {
                local_80 = false;
              }
              if (local_668 != (code *)0x0) {
                (*local_668)(&local_678,&local_678,__destroy_functor);
              }
              local_688 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_680 = "";
              local_698 = &boost::unit_test::basic_cstring<char_const>::null;
              local_690 = &boost::unit_test::basic_cstring<char_const>::null;
              file_24.m_end = &DAT_000000c0;
              file_24.m_begin = (iterator)&local_688;
              msg_24.m_end = pvVar7;
              msg_24.m_begin = pvVar6;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
                         (size_t)&local_698,msg_24);
              rVar3.super_class_property<bool>.value =
                   (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
              local_58._8_8_ = (element_type *)0x0;
              aStack_48._M_allocated_capacity = 0;
              local_748._0_8_ = "addr.IsValid()";
              local_748.m_message.px = (element_type *)0xeddc95;
              local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
              local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
              local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_6a8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6a0 = "";
              pvVar6 = (iterator)0x2;
              pvVar7 = (iterator)0x0;
              local_90._8_8_ = &local_748;
              local_58[0] = rVar3.super_class_property<bool>.value;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                         (check_type)pcVar10,(size_t)&local_6a8,0xc0);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_48._M_allocated_capacity);
              local_6b8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6b0 = "";
              local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_25.m_end = (iterator)0xc1;
              file_25.m_begin = (iterator)&local_6b8;
              msg_25.m_end = pvVar7;
              msg_25.m_begin = pvVar6;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,
                         (size_t)&local_6c8,msg_25);
              local_58[0] = (class_property<bool>)((int)local_60 == 2);
              local_58._8_8_ = (element_type *)0x0;
              aStack_48._M_allocated_capacity = 0;
              local_748._0_8_ = "addr.IsIPv6()";
              local_748.m_message.px = (element_type *)0xeddcf9;
              local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
              local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
              local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_6d8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6d0 = "";
              pvVar6 = (iterator)0x2;
              pvVar7 = (iterator)0x0;
              local_90._8_8_ = &local_748;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                         (check_type)pcVar10,(size_t)&local_6d8,0xc1);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_48._M_allocated_capacity);
              local_6e8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6e0 = "";
              local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_26.m_end = (iterator)0xc2;
              file_26.m_begin = (iterator)&local_6e8;
              msg_26.m_end = pvVar7;
              msg_26.m_begin = pvVar6;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
                         (size_t)&local_6f8,msg_26);
              bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
              local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
              local_58._8_8_ = (element_type *)0x0;
              aStack_48._M_allocated_capacity = 0;
              local_748._0_8_ = "!addr.IsBindAny()";
              local_748.m_message.px = (element_type *)0xeddcbf;
              plVar11 = (lazy_ostream *)local_a0;
              local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
              local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
              local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_708 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_700 = "";
              pvVar6 = (iterator)0x1;
              pvVar7 = (iterator)0x0;
              local_90._8_8_ = &local_748;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,plVar11,1,0,WARN,(check_type)pcVar10,
                         (size_t)&local_708,0xc2);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_48._M_allocated_capacity);
              local_718 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_710 = "";
              local_728 = &boost::unit_test::basic_cstring<char_const>::null;
              local_720 = &boost::unit_test::basic_cstring<char_const>::null;
              file_27.m_end = (iterator)0xc3;
              file_27.m_begin = (iterator)&local_718;
              msg_27.m_end = pvVar7;
              msg_27.m_begin = pvVar6;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                         (size_t)&local_728,msg_27);
              local_748.m_message.px =
                   (element_type *)((ulong)local_748.m_message.px & 0xffffffffffffff00);
              local_748._0_8_ = &PTR__lazy_ostream_013d3cb0;
              local_748.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_730 = "";
              CNetAddr::ToStringAddr_abi_cxx11_(&local_100,(CNetAddr *)&local_78.indirect_contents);
              if (local_100._M_string_length == local_e0._M_string_length) {
                if ((char *)local_100._M_string_length == (char *)0x0) {
                  bVar2 = true;
                }
                else {
                  iVar5 = bcmp(local_100._M_dataplus._M_p,local_e0._M_dataplus._M_p,
                               local_100._M_string_length);
                  bVar2 = iVar5 == 0;
                }
              }
              else {
                bVar2 = false;
              }
              local_120[0] = bVar2;
              local_120._8_8_ = (element_type *)0x0;
              aStack_110._M_allocated_capacity = 0;
              local_140._0_8_ =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_140._8_8_ = "";
              local_90._8_8_ = &local_150;
              local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
              local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
              local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              aStack_48._8_8_ = local_128;
              local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
              local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
              aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pcVar12 = "scoped_addr";
              pcVar10 = "addr.ToStringAddr()";
              uVar8 = 2;
              uVar9 = 0;
              pvVar6 = (iterator)0x1;
              pvVar7 = (iterator)0x2;
              local_150 = &local_100;
              local_128 = (undefined1  [8])&local_e0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_120,(lazy_ostream *)&local_748,1,2,REQUIRE,
                         0xee2515,(size_t)local_140,0xc3,plVar11,"scoped_addr",
                         (assertion_result *)local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_110._M_allocated_capacity);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              local_58._0_8_ = &aStack_48;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_58,local_c0._0_8_,(char *)(local_c0._8_8_ + local_c0._0_8_)
                        );
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "%0");
              std::
              function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                          *)&local_768,&g_dns_lookup_abi_cxx11_);
              dns_lookup_function_05.super__Function_base._M_functor._4_4_ = uVar9;
              dns_lookup_function_05.super__Function_base._M_functor._0_4_ = uVar8;
              dns_lookup_function_05.super__Function_base._M_functor._8_8_ = pcVar10;
              dns_lookup_function_05.super__Function_base._M_manager = (_Manager_type)plVar11;
              dns_lookup_function_05._M_invoker = (_Invoker_type)pcVar12;
              LookupHost((optional<CNetAddr> *)local_a0,(string *)local_58,false,
                         dns_lookup_function_05);
              if (local_80 == false) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                if (0x10 < local_68) {
                  free(local_78.indirect_contents.indirect);
                }
                local_78.indirect_contents.indirect = (char *)local_a0._0_8_;
                local_78.indirect_contents.capacity = local_a0._8_4_;
                local_78._12_4_ = local_a0._12_4_;
                local_68 = local_90._M_allocated_capacity._0_4_;
                local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffff00000000
                ;
                local_60 = (string **)local_90._8_8_;
                if (local_80 == true) {
                  local_80 = false;
                }
                if (local_758 != (code *)0x0) {
                  (*local_758)(&local_768,&local_768,__destroy_functor);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._0_8_ != &aStack_48) {
                  operator_delete((void *)local_58._0_8_,
                                  (ulong)(aStack_48._M_allocated_capacity + 1));
                }
                local_778 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_770 = "";
                local_788 = &boost::unit_test::basic_cstring<char_const>::null;
                local_780 = &boost::unit_test::basic_cstring<char_const>::null;
                file_28.m_end = (iterator)0xc7;
                file_28.m_begin = (iterator)&local_778;
                msg_28.m_end = pvVar7;
                msg_28.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                           (size_t)&local_788,msg_28);
                rVar3.super_class_property<bool>.value =
                     (class_property<bool>)
                     CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsValid()";
                local_748.m_message.px = (element_type *)0xeddc95;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_798 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_790 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = (lazy_ostream *)&local_748;
                local_58[0] = rVar3.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_798,199);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_7a8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7a0 = "";
                local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_29.m_end = (iterator)0xc8;
                file_29.m_begin = (iterator)&local_7a8;
                msg_29.m_end = pvVar7;
                msg_29.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                           (size_t)&local_7b8,msg_29);
                local_58[0] = (class_property<bool>)((int)local_60 == 2);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsIPv6()";
                local_748.m_message.px = (element_type *)0xeddcf9;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_7c8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7c0 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = (lazy_ostream *)&local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_7c8,200);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_7d8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7d0 = "";
                local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_30.m_end = (iterator)0xc9;
                file_30.m_begin = (iterator)&local_7d8;
                msg_30.m_end = pvVar7;
                msg_30.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                           (size_t)&local_7e8,msg_30);
                bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
                local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsBindAny()";
                local_748.m_message.px = (element_type *)0xeddcbf;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_7f8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7f0 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = (lazy_ostream *)&local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_7f8,0xc9);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_808 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_800 = "";
                local_818 = &boost::unit_test::basic_cstring<char_const>::null;
                local_810 = &boost::unit_test::basic_cstring<char_const>::null;
                file_31.m_end = (iterator)0xca;
                file_31.m_begin = (iterator)&local_808;
                msg_31.m_end = pvVar7;
                msg_31.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,
                           (size_t)&local_818,msg_31);
                local_748.m_message.px =
                     (element_type *)((ulong)local_748.m_message.px & 0xffffffffffffff00);
                local_748._0_8_ = &PTR__lazy_ostream_013d3cb0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_730 = "";
                CNetAddr::ToStringAddr_abi_cxx11_
                          (&local_100,(CNetAddr *)&local_78.indirect_contents);
                if (local_100._M_string_length == local_c0._8_8_) {
                  if ((char *)local_100._M_string_length == (char *)0x0) {
                    bVar2 = true;
                  }
                  else {
                    iVar5 = bcmp(local_100._M_dataplus._M_p,(void *)local_c0._0_8_,
                                 local_100._M_string_length);
                    bVar2 = iVar5 == 0;
                  }
                }
                else {
                  bVar2 = false;
                }
                local_120[0] = bVar2;
                local_120._8_8_ = (element_type *)0x0;
                aStack_110._M_allocated_capacity = 0;
                local_140._0_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_140._8_8_ = "";
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_90._8_8_ = &local_150;
                local_128 = (undefined1  [8])local_c0;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                aStack_48._8_8_ = local_128;
                pcVar10 = "addr.ToStringAddr()";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x2;
                local_150 = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_120,(lazy_ostream *)&local_748,1,2,REQUIRE,
                           0xee2515,(size_t)local_140,0xca,(lazy_ostream *)local_a0,"link_local",
                           (assertion_result *)local_58);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_110._M_allocated_capacity);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                local_828 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_820 = "";
                local_838 = &boost::unit_test::basic_cstring<char_const>::null;
                local_830 = &boost::unit_test::basic_cstring<char_const>::null;
                file_32.m_end = (iterator)0xcd;
                file_32.m_begin = (iterator)&local_828;
                msg_32.m_end = pvVar7;
                msg_32.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,
                           (size_t)&local_838,msg_32);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,"6hzph5hv6337r6p2.onion","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p = "!addr.SetSpecial(\"6hzph5hv6337r6p2.onion\")";
                local_100._M_string_length = 0xedddb8;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_848 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_840 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_848,0xcd);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1)
                                 );
                }
                local_850 = "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion";
                local_860 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_858 = "";
                local_870 = &boost::unit_test::basic_cstring<char_const>::null;
                local_868 = &boost::unit_test::basic_cstring<char_const>::null;
                file_33.m_end = (iterator)0xd1;
                file_33.m_begin = (iterator)&local_860;
                msg_33.m_end = pvVar7;
                msg_33.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,
                           (size_t)&local_870,msg_33);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_a0,local_850,(allocator<char> *)local_120);
                rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
                     (readonly_property<bool>)
                     CNetAddr::SetSpecial
                               ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p = "addr.SetSpecial(torv3_addr)";
                local_100._M_string_length = 0xedddd4;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_880 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_878 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,2,0,WARN,(check_type)pcVar10,
                           (size_t)&local_880,0xd1);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1)
                                 );
                }
                local_890 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_888 = "";
                local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_898 = &boost::unit_test::basic_cstring<char_const>::null;
                file_34.m_end = &DAT_000000d2;
                file_34.m_begin = (iterator)&local_890;
                msg_34.m_end = pvVar7;
                msg_34.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,
                           (size_t)&local_8a0,msg_34);
                rVar3.super_class_property<bool>.value =
                     (class_property<bool>)
                     CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsValid()";
                local_748.m_message.px = (element_type *)0xeddc95;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_8b0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8a8 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                local_58[0] = rVar3.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_8b0,0xd2);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_8c0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8b8 = "";
                local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_35.m_end = (iterator)0xd3;
                file_35.m_begin = (iterator)&local_8c0;
                msg_35.m_end = pvVar7;
                msg_35.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,
                           (size_t)&local_8d0,msg_35);
                local_58[0] = (class_property<bool>)((int)local_60 == 3);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsTor()";
                local_748.m_message.px = (element_type *)0xede03c;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_8e0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8d8 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_8e0,0xd3);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_8f0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8e8 = "";
                local_900 = &boost::unit_test::basic_cstring<char_const>::null;
                local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_36.m_end = (iterator)0xd5;
                file_36.m_begin = (iterator)&local_8f0;
                msg_36.m_end = pvVar7;
                msg_36.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,
                           (size_t)&local_900,msg_36);
                local_58[0] = (class_property<bool>)((int)local_60 != 4);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsI2P()";
                local_748.m_message.px = (element_type *)0xeddde2;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_910 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_908 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_910,0xd5);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_920 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_918 = "";
                local_930 = &boost::unit_test::basic_cstring<char_const>::null;
                local_928 = &boost::unit_test::basic_cstring<char_const>::null;
                file_37.m_end = (iterator)0xd6;
                file_37.m_begin = (iterator)&local_920;
                msg_37.m_end = pvVar7;
                msg_37.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,
                           (size_t)&local_930,msg_37);
                bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
                local_58[0] = (class_property<bool>)!bVar2;
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsBindAny()";
                local_748.m_message.px = (element_type *)0xeddcbf;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_940 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_938 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_940,0xd6);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_950 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_948 = "";
                local_960 = &boost::unit_test::basic_cstring<char_const>::null;
                local_958 = &boost::unit_test::basic_cstring<char_const>::null;
                file_38.m_end = (iterator)0xd7;
                file_38.m_begin = (iterator)&local_950;
                msg_38.m_end = pvVar7;
                msg_38.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,
                           (size_t)&local_960,msg_38);
                bVar2 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
                local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsAddrV1Compatible()";
                local_748.m_message.px = (element_type *)0xedddfd;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_970 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_968 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_970,0xd7);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_980 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_978 = "";
                local_990 = &boost::unit_test::basic_cstring<char_const>::null;
                local_988 = &boost::unit_test::basic_cstring<char_const>::null;
                file_39.m_end = (iterator)0xd8;
                file_39.m_begin = (iterator)&local_980;
                msg_39.m_end = pvVar7;
                msg_39.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,
                           (size_t)&local_990,msg_39);
                local_748.m_message.px =
                     (element_type *)((ulong)local_748.m_message.px & 0xffffffffffffff00);
                local_748._0_8_ = &PTR__lazy_ostream_013d3cb0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_730 = "";
                CNetAddr::ToStringAddr_abi_cxx11_
                          (&local_100,(CNetAddr *)&local_78.indirect_contents);
                iVar5 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_100,local_850);
                local_120[0] = iVar5 == 0;
                local_120._8_8_ = (element_type *)0x0;
                aStack_110._M_allocated_capacity = 0;
                local_140._0_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_140._8_8_ = "";
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_90._8_8_ = &local_150;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d4270;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                aStack_48._8_8_ = local_128;
                pcVar10 = "addr.ToStringAddr()";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x2;
                local_150 = &local_100;
                local_128 = (undefined1  [8])&local_850;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_120,(lazy_ostream *)&local_748,1,2,REQUIRE,
                           0xee2515,(size_t)local_140,0xd8,(lazy_ostream *)local_a0,"torv3_addr",
                           (assertion_result *)local_58);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_110._M_allocated_capacity);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                local_9a0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_998 = "";
                local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_40.m_end = (iterator)0xdb;
                file_40.m_begin = (iterator)&local_9a0;
                msg_40.m_end = pvVar7;
                msg_40.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,
                           (size_t)&local_9b0,msg_40);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,
                           "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.onion","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.onion\")"
                ;
                local_100._M_string_length = 0xedde9a;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_9c0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9b8 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_9c0,0xdb);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1)
                                 );
                }
                local_9d0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9c8 = "";
                local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_41.m_end = (iterator)0xde;
                file_41.m_begin = (iterator)&local_9d0;
                msg_41.m_end = pvVar7;
                msg_41.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,
                           (size_t)&local_9e0,msg_41);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,
                           "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscrye.onion","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscrye.onion\")"
                ;
                local_100._M_string_length = 0xeddf2c;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_9f0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9e8 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_9f0,0xde);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1)
                                 );
                }
                local_a00 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9f8 = "";
                local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
                local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
                file_42.m_end = (iterator)0xe2;
                file_42.m_begin = (iterator)&local_a00;
                msg_42.m_end = pvVar7;
                msg_42.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,
                           (size_t)&local_a10,msg_42);
                local_a0._0_8_ = &local_90;
                local_58._0_8_ = (pointer)0x42;
                __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0,(size_type *)local_58,0);
                uVar1 = local_58._0_8_;
                local_90._M_allocated_capacity = local_58._0_8_;
                local_a0._0_8_ = __dest;
                memcpy(__dest,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd",0x42);
                local_a0._8_8_ = uVar1;
                __dest->_M_local_buf[uVar1] = '\0';
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(std::string{ \"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd\\0wtf.onion\", 66})"
                ;
                local_100._M_string_length = 0xeddf96;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_a20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a18 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_a20,0xe2);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_a30 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a28 = "";
                local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
                local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
                file_43.m_end = (iterator)0xe5;
                file_43.m_begin = (iterator)&local_a30;
                msg_43.m_end = pvVar7;
                msg_43.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,
                           (size_t)&local_a40,msg_43);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,"mfrggzak.onion","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p = "!addr.SetSpecial(std::string{\"mfrggzak.onion\"})";
                local_100._M_string_length = 0xeddfd5;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_a50 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a48 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_a50,0xe5);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_a60 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a58 = "";
                local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
                local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
                file_44.m_end = (iterator)0xe8;
                file_44.m_begin = (iterator)&local_a60;
                msg_44.m_end = pvVar7;
                msg_44.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,
                           (size_t)&local_a70,msg_44);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,"mf*g zak.onion","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p = "!addr.SetSpecial(std::string{\"mf*g zak.onion\"})";
                local_100._M_string_length = 0xede014;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_a80 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a78 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_a80,0xe8);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_a90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a88 = "";
                local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
                file_45.m_end = (iterator)0xec;
                file_45.m_begin = (iterator)&local_a90;
                msg_45.m_end = pvVar7;
                msg_45.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,
                           (size_t)&local_aa0,msg_45);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,
                           "UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P","");
                rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
                     (readonly_property<bool>)
                     CNetAddr::SetSpecial
                               ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p = "addr.SetSpecial(i2p_addr)";
                local_100._M_string_length = 0xede02e;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_ab0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_aa8 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,2,0,WARN,(check_type)pcVar10,
                           (size_t)&local_ab0,0xec);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_ac0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ab8 = "";
                local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_46.m_end = (iterator)0xed;
                file_46.m_begin = (iterator)&local_ac0;
                msg_46.m_end = pvVar7;
                msg_46.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,
                           (size_t)&local_ad0,msg_46);
                rVar3.super_class_property<bool>.value =
                     (class_property<bool>)
                     CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsValid()";
                local_748.m_message.px = (element_type *)0xeddc95;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_ae0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ad8 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                local_58[0] = rVar3.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_ae0,0xed);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_af0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ae8 = "";
                local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
                local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_47.m_end = (iterator)0xee;
                file_47.m_begin = (iterator)&local_af0;
                msg_47.m_end = pvVar7;
                msg_47.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,
                           (size_t)&local_b00,msg_47);
                local_58[0] = (class_property<bool>)((int)local_60 == 4);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsI2P()";
                local_748.m_message.px = (element_type *)0xeddde2;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_b10 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b08 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_b10,0xee);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_b20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b18 = "";
                local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
                file_48.m_end = (iterator)0xf0;
                file_48.m_begin = (iterator)&local_b20;
                msg_48.m_end = pvVar7;
                msg_48.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,
                           (size_t)&local_b30,msg_48);
                local_58[0] = (class_property<bool>)((int)local_60 != 3);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsTor()";
                local_748.m_message.px = (element_type *)0xede03c;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_b40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b38 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_b40,0xf0);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_b50 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b48 = "";
                local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
                file_49.m_end = (iterator)0xf1;
                file_49.m_begin = (iterator)&local_b50;
                msg_49.m_end = pvVar7;
                msg_49.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,
                           (size_t)&local_b60,msg_49);
                bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
                local_58[0] = (class_property<bool>)!bVar2;
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsBindAny()";
                local_748.m_message.px = (element_type *)0xeddcbf;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_b70 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b68 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_b70,0xf1);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_b80 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b78 = "";
                local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
                file_50.m_end = (iterator)0xf2;
                file_50.m_begin = (iterator)&local_b80;
                msg_50.m_end = pvVar7;
                msg_50.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,
                           (size_t)&local_b90,msg_50);
                bVar2 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
                local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsAddrV1Compatible()";
                local_748.m_message.px = (element_type *)0xedddfd;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_ba0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b98 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_ba0,0xf2);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_bb0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ba8 = "";
                local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_51.m_end = (iterator)0xf3;
                file_51.m_begin = (iterator)&local_bb0;
                msg_51.m_end = pvVar7;
                msg_51.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,
                           (size_t)&local_bc0,msg_51);
                local_748.m_message.px =
                     (element_type *)((ulong)local_748.m_message.px & 0xffffffffffffff00);
                local_748._0_8_ = &PTR__lazy_ostream_013d3cb0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_730 = "";
                CNetAddr::ToStringAddr_abi_cxx11_
                          (&local_100,(CNetAddr *)&local_78.indirect_contents);
                str._M_str = "UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P";
                str._M_len = 0x3c;
                ToLower_abi_cxx11_((string *)local_120,str);
                if (local_100._M_string_length == local_120._8_8_) {
                  if ((element_type *)local_100._M_string_length == (element_type *)0x0) {
                    bVar2 = true;
                  }
                  else {
                    iVar5 = bcmp(local_100._M_dataplus._M_p,(void *)local_120._0_8_,
                                 local_100._M_string_length);
                    bVar2 = iVar5 == 0;
                  }
                }
                else {
                  bVar2 = false;
                }
                local_140[0] = bVar2;
                local_140._8_8_ = (element_type *)0x0;
                auStack_130 = (undefined1  [8])0x0;
                local_150 = (string *)0xedd732;
                local_148 = "";
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_90._8_8_ = local_128;
                aStack_48._8_8_ = &local_158;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                pcVar10 = "addr.ToStringAddr()";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x2;
                local_158 = (string *)local_120;
                local_128 = (undefined1  [8])&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_140,(lazy_ostream *)&local_748,1,2,REQUIRE,
                           0xee2515,(size_t)&local_150,0xf3,(lazy_ostream *)local_a0,
                           "ToLower(i2p_addr)",(assertion_result *)local_58);
                boost::detail::shared_count::~shared_count((shared_count *)(local_140 + 0x10));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._0_8_ != &aStack_110) {
                  operator_delete((void *)local_120._0_8_,
                                  (ulong)(aStack_110._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                local_bd0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_bc8 = "";
                local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_52.m_end = (iterator)0xf6;
                file_52.m_begin = (iterator)&local_bd0;
                msg_52.m_end = pvVar7;
                msg_52.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,
                           (size_t)&local_be0,msg_52);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,
                           "udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jn=.b32.i2p","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(\"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jn=.b32.i2p\")"
                ;
                local_100._M_string_length = 0xede0dc;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_bf0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_be8 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_bf0,0xf6);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1)
                                 );
                }
                local_c00 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_bf8 = "";
                local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c08 = &boost::unit_test::basic_cstring<char_const>::null;
                file_53.m_end = (iterator)0xf9;
                file_53.m_begin = (iterator)&local_c00;
                msg_53.m_end = pvVar7;
                msg_53.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,
                           (size_t)&local_c10,msg_53);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,
                           "udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna=.b32.i2p","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(\"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna=.b32.i2p\")"
                ;
                local_100._M_string_length = 0xede16c;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_c20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c18 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_c20,0xf9);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1)
                                 );
                }
                local_c30 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c28 = "";
                local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
                file_54.m_end = (iterator)0xfc;
                file_54.m_begin = (iterator)&local_c30;
                msg_54.m_end = pvVar7;
                msg_54.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
                           (size_t)&local_c40,msg_54);
                local_a0._0_8_ = &local_90;
                local_58._0_8_ = (pointer)0x3c;
                local_a0._0_8_ =
                     std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a0,(size_type *)local_58,0);
                local_90._M_allocated_capacity = local_58._0_8_;
                *(char *)(local_a0._0_8_ + 0x2c) = 'q';
                *(char *)(local_a0._0_8_ + 0x2d) = 'w';
                *(char *)(local_a0._0_8_ + 0x2e) = '2';
                *(char *)(local_a0._0_8_ + 0x2f) = 'v';
                *(char *)(local_a0._0_8_ + 0x30) = '\0';
                *(char *)(local_a0._0_8_ + 0x31) = 'w';
                *(char *)(local_a0._0_8_ + 0x32) = 't';
                *(char *)(local_a0._0_8_ + 0x33) = 'f';
                *(char *)(local_a0._0_8_ + 0x34) = '.';
                *(char *)(local_a0._0_8_ + 0x35) = 'b';
                *(char *)(local_a0._0_8_ + 0x36) = '3';
                *(char *)(local_a0._0_8_ + 0x37) = '2';
                *(char *)(local_a0._0_8_ + 0x38) = '.';
                *(char *)(local_a0._0_8_ + 0x39) = 'i';
                *(char *)(local_a0._0_8_ + 0x3a) = '2';
                *(char *)(local_a0._0_8_ + 0x3b) = 'p';
                *(char *)(local_a0._0_8_ + 0x20) = '4';
                *(char *)(local_a0._0_8_ + 0x21) = 'd';
                *(char *)(local_a0._0_8_ + 0x22) = 'p';
                *(char *)(local_a0._0_8_ + 0x23) = 'l';
                *(char *)(local_a0._0_8_ + 0x24) = '3';
                *(char *)(local_a0._0_8_ + 0x25) = 'p';
                *(char *)(local_a0._0_8_ + 0x26) = 'l';
                *(char *)(local_a0._0_8_ + 0x27) = '4';
                *(char *)(local_a0._0_8_ + 0x28) = 'u';
                *(char *)(local_a0._0_8_ + 0x29) = 't';
                *(char *)(local_a0._0_8_ + 0x2a) = 'g';
                *(char *)(local_a0._0_8_ + 0x2b) = 'q';
                *(char *)(local_a0._0_8_ + 0x2c) = 'q';
                *(char *)(local_a0._0_8_ + 0x2d) = 'w';
                *(char *)(local_a0._0_8_ + 0x2e) = '2';
                *(char *)(local_a0._0_8_ + 0x2f) = 'v';
                *(char *)(local_a0._0_8_ + 0x10) = 's';
                *(char *)(local_a0._0_8_ + 0x11) = 'k';
                *(char *)(local_a0._0_8_ + 0x12) = 'j';
                *(char *)(local_a0._0_8_ + 0x13) = 'y';
                *(char *)(local_a0._0_8_ + 0x14) = 'r';
                *(char *)(local_a0._0_8_ + 0x15) = '5';
                *(char *)(local_a0._0_8_ + 0x16) = 'z';
                *(char *)(local_a0._0_8_ + 0x17) = 't';
                *(char *)(local_a0._0_8_ + 0x18) = 'p';
                *(char *)(local_a0._0_8_ + 0x19) = 'e';
                *(char *)(local_a0._0_8_ + 0x1a) = 's';
                *(char *)(local_a0._0_8_ + 0x1b) = 'z';
                *(char *)(local_a0._0_8_ + 0x1c) = 'y';
                *(char *)(local_a0._0_8_ + 0x1d) = 'd';
                *(char *)(local_a0._0_8_ + 0x1e) = 'b';
                *(char *)(local_a0._0_8_ + 0x1f) = 'h';
                *(undefined8 *)local_a0._0_8_ = 0x6372747264686475;
                *(char *)(local_a0._0_8_ + 8) = 'e';
                *(char *)(local_a0._0_8_ + 9) = 't';
                *(char *)(local_a0._0_8_ + 10) = 'j';
                *(char *)(local_a0._0_8_ + 0xb) = 'm';
                *(char *)(local_a0._0_8_ + 0xc) = '5';
                *(char *)(local_a0._0_8_ + 0xd) = 's';
                *(char *)(local_a0._0_8_ + 0xe) = 'x';
                *(char *)(local_a0._0_8_ + 0xf) = 'z';
                local_a0._8_8_ = local_58._0_8_;
                *(char *)(local_a0._0_8_ + local_58._0_8_) = '\0';
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(\"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v\\0wtf.b32.i2p\"s)"
                ;
                local_100._M_string_length = 0xede1bf;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_c50 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c48 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_c50,0xfc);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_c60 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c58 = "";
                local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
                file_55.m_end = (iterator)0x102;
                file_55.m_begin = (iterator)&local_c60;
                msg_55.m_end = pvVar7;
                msg_55.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,
                           (size_t)&local_c70,msg_55);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,
                           "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.b32.i2p","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.b32.i2p\")"
                ;
                local_100._M_string_length = 0xede255;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_c80 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c78 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_c80,0x102);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_c90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c88 = "";
                local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
                file_56.m_end = (iterator)0x105;
                file_56.m_begin = (iterator)&local_c90;
                msg_56.m_end = pvVar7;
                msg_56.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,
                           (size_t)&local_ca0,msg_56);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,"tp*szydbh4dp.b32.i2p","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p =
                     "!addr.SetSpecial(std::string{\"tp*szydbh4dp.b32.i2p\"})";
                local_100._M_string_length = 0xede2a0;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_cb0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ca8 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_cb0,0x105);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"esffpp","");
                CNetAddr::SetInternal((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
                }
                local_cc0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_cb8 = "";
                local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_57.m_end = (iterator)0x109;
                file_57.m_begin = (iterator)&local_cc0;
                msg_57.m_end = pvVar7;
                msg_57.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,
                           (size_t)&local_cd0,msg_57);
                bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsValid()";
                local_748.m_message.px = (element_type *)0xeddc95;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_ce0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_cd8 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_ce0,0x109);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_cf0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ce8 = "";
                local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
                local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_58.m_end = (iterator)0x10a;
                file_58.m_begin = (iterator)&local_cf0;
                msg_58.m_end = pvVar7;
                msg_58.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,
                           (size_t)&local_d00,msg_58);
                local_58[0] = (class_property<bool>)
                              CNetAddr::IsInternal((CNetAddr *)&local_78.indirect_contents);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsInternal()";
                local_748.m_message.px = (element_type *)0xede2b9;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_d10 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d08 = "";
                pvVar6 = (iterator)0x2;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,2,0,WARN,
                           (check_type)pcVar10,(size_t)&local_d10,0x10a);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_d20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d18 = "";
                local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
                local_d28 = &boost::unit_test::basic_cstring<char_const>::null;
                file_59.m_end = (iterator)0x10c;
                file_59.m_begin = (iterator)&local_d20;
                msg_59.m_end = pvVar7;
                msg_59.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,
                           (size_t)&local_d30,msg_59);
                bVar2 = CNetAddr::IsBindAny((CNetAddr *)&local_78.indirect_contents);
                local_58[0] = (class_property<bool>)!bVar2;
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "!addr.IsBindAny()";
                local_748.m_message.px = (element_type *)0xeddcbf;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_d40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d38 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_d40,0x10c);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_d50 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d48 = "";
                local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
                local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
                file_60.m_end = (iterator)0x10d;
                file_60.m_begin = (iterator)&local_d50;
                msg_60.m_end = pvVar7;
                msg_60.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,
                           (size_t)&local_d60,msg_60);
                local_58[0] = (class_property<bool>)
                              CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
                local_58._8_8_ = (element_type *)0x0;
                aStack_48._M_allocated_capacity = 0;
                local_748._0_8_ = "addr.IsAddrV1Compatible()";
                local_748.m_message.px = (element_type *)0xedddfd;
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3df0;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_d70 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d68 = "";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x0;
                local_90._8_8_ = &local_748;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_58,(lazy_ostream *)local_a0,1,0,WARN,
                           (check_type)pcVar10,(size_t)&local_d70,0x10d);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_48._M_allocated_capacity);
                local_d80 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d78 = "";
                local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
                local_d88 = &boost::unit_test::basic_cstring<char_const>::null;
                file_61.m_end = (iterator)0x10e;
                file_61.m_begin = (iterator)&local_d80;
                msg_61.m_end = pvVar7;
                msg_61.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,
                           (size_t)&local_d90,msg_61);
                local_748.m_message.px =
                     (element_type *)((ulong)local_748.m_message.px & 0xffffffffffffff00);
                local_748._0_8_ = &PTR__lazy_ostream_013d3cb0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_730 = "";
                CNetAddr::ToStringAddr_abi_cxx11_
                          (&local_100,(CNetAddr *)&local_78.indirect_contents);
                iVar5 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_100,"esffpvrt3wpeaygy.internal");
                local_120[0] = iVar5 == 0;
                local_120._8_8_ = (element_type *)0x0;
                aStack_110._M_allocated_capacity = 0;
                local_140._0_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_140._8_8_ = "";
                local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
                local_a0._0_8_ = &PTR__lazy_ostream_013d3d70;
                local_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_128 = (undefined1  [8])0xede2ba;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d6778;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                aStack_48._8_8_ = local_128;
                pcVar10 = "addr.ToStringAddr()";
                pvVar6 = (iterator)0x1;
                pvVar7 = (iterator)0x2;
                local_150 = &local_100;
                local_90._8_8_ = &local_150;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_120,(lazy_ostream *)&local_748,1,2,REQUIRE,
                           0xee2515,(size_t)local_140,0x10e,(lazy_ostream *)local_a0,
                           "\"esffpvrt3wpeaygy.internal\"",(assertion_result *)local_58);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_110._M_allocated_capacity);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                local_da0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d98 = "";
                local_db0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_da8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_62.m_end = (iterator)0x111;
                file_62.m_begin = (iterator)&local_da0;
                msg_62.m_end = pvVar7;
                msg_62.m_begin = pvVar6;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,
                           (size_t)&local_db0,msg_62);
                local_a0._0_8_ = &local_90;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,"totally bogus","");
                bVar2 = CNetAddr::SetSpecial
                                  ((CNetAddr *)&local_78.indirect_contents,(string *)local_a0);
                local_748.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
                local_748.m_message.px = (element_type *)0x0;
                local_748.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_100._M_dataplus._M_p = "!addr.SetSpecial(\"totally bogus\")";
                local_100._M_string_length = 0xede31f;
                local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
                aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_dc0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_db8 = "";
                aStack_48._8_8_ = &local_100;
                boost::test_tools::tt_detail::report_assertion
                          (&local_748,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar10,
                           (size_t)&local_dc0,0x111);
                boost::detail::shared_count::~shared_count(&local_748.m_message.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._0_8_ != &local_90) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1)
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                if ((_func_int **)local_c0._0_8_ != &local_b0) {
                  operator_delete((void *)local_c0._0_8_,(ulong)(local_b0 + 1));
                }
                if (0x10 < local_68) {
                  free(local_78.indirect_contents.indirect);
                  local_78.indirect_contents.indirect = (char *)0x0;
                }
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_basic)
{
    CNetAddr addr;

    // IPv4, INADDR_ANY
    addr = LookupHost("0.0.0.0", false).value();
    BOOST_REQUIRE(!addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv4());

    BOOST_CHECK(addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "0.0.0.0");

    // IPv4, INADDR_NONE
    addr = LookupHost("255.255.255.255", false).value();
    BOOST_REQUIRE(!addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv4());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "255.255.255.255");

    // IPv4, casual
    addr = LookupHost("12.34.56.78", false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv4());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "12.34.56.78");

    // IPv6, in6addr_any
    addr = LookupHost("::", false).value();
    BOOST_REQUIRE(!addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());

    BOOST_CHECK(addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "::");

    // IPv6, casual
    addr = LookupHost("1122:3344:5566:7788:9900:aabb:ccdd:eeff", false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "1122:3344:5566:7788:9900:aabb:ccdd:eeff");

    // IPv6, scoped/link-local. See https://tools.ietf.org/html/rfc4007
    // We support non-negative decimal integers (uint32_t) as zone id indices.
    // Normal link-local scoped address functionality is to append "%" plus the
    // zone id, for example, given a link-local address of "fe80::1" and a zone
    // id of "32", return the address as "fe80::1%32".
    const std::string link_local{"fe80::1"};
    const std::string scoped_addr{link_local + "%32"};
    addr = LookupHost(scoped_addr, false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), scoped_addr);

    // Test that the delimiter "%" and default zone id of 0 can be omitted for the default scope.
    addr = LookupHost(link_local + "%0", false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), link_local);

    // TORv2, no longer supported
    BOOST_CHECK(!addr.SetSpecial("6hzph5hv6337r6p2.onion"));

    // TORv3
    const char* torv3_addr = "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion";
    BOOST_REQUIRE(addr.SetSpecial(torv3_addr));
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsTor());

    BOOST_CHECK(!addr.IsI2P());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), torv3_addr);

    // TORv3, broken, with wrong checksum
    BOOST_CHECK(!addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.onion"));

    // TORv3, broken, with wrong version
    BOOST_CHECK(!addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscrye.onion"));

    // TORv3, malicious
    BOOST_CHECK(!addr.SetSpecial(std::string{
        "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd\0wtf.onion", 66}));

    // TOR, bogus length
    BOOST_CHECK(!addr.SetSpecial(std::string{"mfrggzak.onion"}));

    // TOR, invalid base32
    BOOST_CHECK(!addr.SetSpecial(std::string{"mf*g zak.onion"}));

    // I2P
    const char* i2p_addr = "UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P";
    BOOST_REQUIRE(addr.SetSpecial(i2p_addr));
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsI2P());

    BOOST_CHECK(!addr.IsTor());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), ToLower(i2p_addr));

    // I2P, correct length, but decodes to less than the expected number of bytes.
    BOOST_CHECK(!addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jn=.b32.i2p"));

    // I2P, extra unnecessary padding
    BOOST_CHECK(!addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna=.b32.i2p"));

    // I2P, malicious
    BOOST_CHECK(!addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v\0wtf.b32.i2p"s));

    // I2P, valid but unsupported (56 Base32 characters)
    // See "Encrypted LS with Base 32 Addresses" in
    // https://geti2p.net/spec/encryptedleaseset.txt
    BOOST_CHECK(
        !addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.b32.i2p"));

    // I2P, invalid base32
    BOOST_CHECK(!addr.SetSpecial(std::string{"tp*szydbh4dp.b32.i2p"}));

    // Internal
    addr.SetInternal("esffpp");
    BOOST_REQUIRE(!addr.IsValid()); // "internal" is considered invalid
    BOOST_REQUIRE(addr.IsInternal());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "esffpvrt3wpeaygy.internal");

    // Totally bogus
    BOOST_CHECK(!addr.SetSpecial("totally bogus"));
}